

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,
          back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar1;
  undefined8 *in_RSI;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> in_RDI;
  undefined8 in_stack_ffffffffffffffe8;
  
  bVar1 = internal::
          format_decimal<wchar_t,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long>
                    (in_RDI,(unsigned_long)in_RSI,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  *in_RSI = bVar1.container;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }